

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_map_array_equal_null(void)

{
  size_type in_RCX;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *ppVar1;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_00;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_2a0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_288;
  undefined1 local_279;
  basic_variable<std::allocator<char>_> local_278;
  undefined1 local_23d;
  int local_23c;
  basic_variable<std::allocator<char>_> local_238;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_200;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1f8;
  undefined1 local_198 [77];
  undefined1 local_14b [2];
  undefined1 local_149;
  basic_variable<std::allocator<char>_> local_148;
  undefined1 local_109;
  int local_108 [4];
  basic_variable<std::allocator<char>_> local_f8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_c0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_b8;
  undefined1 local_58 [78];
  undefined1 local_a [2];
  
  local_109 = 1;
  local_c0 = &local_b8;
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_108[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<trial::dynamic::basic_variable<std::allocator<char>_>,_int,_true>
            (&local_b8,&local_f8,local_108);
  local_109 = 0;
  local_58._0_8_ = &local_b8;
  local_58._8_8_ = 1;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_58 + 0x10),
             (basic_map<std::allocator<char>_> *)local_58._0_8_,init);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_148);
  local_a[0] = trial::dynamic::operator==
                         ((basic_variable<std::allocator<char>_> *)(local_58 + 0x10),&local_148);
  local_149 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {array::make(), 1} }) == variable()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdb7,"void equality_suite::compare_map_array_equal_null()",local_a,&local_149);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_148);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_58 + 0x10));
  ppVar1 = &local_b8;
  local_288 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_58;
  do {
    local_288 = local_288 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_288);
  } while (local_288 != ppVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_f8);
  local_23d = 1;
  local_200 = &local_1f8;
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_23c = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<trial::dynamic::basic_variable<std::allocator<char>_>,_int,_true>
            (&local_1f8,&local_238,&local_23c);
  local_23d = 0;
  local_198._0_8_ = &local_1f8;
  local_198._8_8_ = 1;
  init_00._M_len = (size_type)ppVar1;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_198 + 0x10),
             (basic_map<std::allocator<char>_> *)local_198._0_8_,init_00);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_278);
  local_14b[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_198 + 0x10),&local_278);
  local_279 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {array::make(), 1} }) != variable()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdb8,"void equality_suite::compare_map_array_equal_null()",local_14b,&local_279);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_278);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_198 + 0x10));
  local_2a0 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_198;
  do {
    local_2a0 = local_2a0 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_2a0);
  } while (local_2a0 != &local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_238);
  return;
}

Assistant:

void compare_map_array_equal_null()
{
    TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {array::make(), 1} }) == variable(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {array::make(), 1} }) != variable(), true);
}